

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O2

void cmdusage(void)

{
  long lVar1;
  int iVar2;
  char *__s;
  
  cmdinfo();
  fprintf(_stderr,"usage: %s [options]\n",cmdname);
  __s = "The following options are supported:\n";
  for (lVar1 = 1; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    fputs(__s,_stderr);
    __s = helpinfo[lVar1];
  }
  fwrite("The following formats are supported:\n",0x25,1,_stderr);
  iVar2 = 0;
  while( true ) {
    lVar1 = jas_image_lookupfmtbyid(iVar2);
    if (lVar1 == 0) break;
    fprintf(_stderr,"    %-5s    %s\n",*(undefined8 *)(lVar1 + 8),*(undefined8 *)(lVar1 + 0x18));
    iVar2 = iVar2 + 1;
  }
  exit(1);
}

Assistant:

void cmdusage()
{
	int fmtid;
	const jas_image_fmtinfo_t *fmtinfo;
	const char *s;
	int i;
	cmdinfo();
	fprintf(stderr, "usage: %s [options]\n", cmdname);
	for (i = 0, s = helpinfo[i]; s; ++i, s = helpinfo[i]) {
		fprintf(stderr, "%s", s);
	}
	fprintf(stderr, "The following formats are supported:\n");
	for (fmtid = 0;; ++fmtid) {
		if (!(fmtinfo = jas_image_lookupfmtbyid(fmtid))) {
			break;
		}
		fprintf(stderr, "    %-5s    %s\n", fmtinfo->name,
		  fmtinfo->desc);
	}
	exit(EXIT_FAILURE);
}